

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::get_remainder(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                *__return_storage_ptr__,
               RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *this,size_t in_times_split)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __end;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_50;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_48;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_40;
  const_iterator local_38;
  value_type local_30;
  value_type index;
  ulong local_20;
  size_t in_times_split_local;
  RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  
  index._7_1_ = 0;
  local_20 = in_times_split;
  in_times_split_local = (size_t)this;
  this_local = (RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  uVar1 = local_20;
  sVar2 = std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::size(&this->m_tokens);
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_token_indexes,local_20);
    local_30 = *pvVar3;
    local_40._M_current =
         (wchar_t *)
         std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
         end(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::__normal_iterator<wchar_t*>
              ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_38,&local_40);
    local_50._M_current =
         (wchar_t *)
         std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
         begin(&this->m_str);
    local_48 = __gnu_cxx::
               __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               ::operator+(&local_50,local_30);
    __end = std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
            ::end(&this->m_str);
    std::__cxx11::wstring::insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
              ((wstring *)__return_storage_ptr__,local_38,local_48,
               (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                )__end._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}